

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::image_utils::error_metrics>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  error_metrics *pSrc;
  
  if (num != 0) {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)pDst_void + lVar6 + 0x20) =
           *(undefined8 *)((long)pSrc_void + lVar6 + 0x20);
      uVar3 = *(undefined8 *)((long)pSrc_void + lVar6);
      uVar4 = ((undefined8 *)((long)pSrc_void + lVar6))[1];
      puVar1 = (undefined8 *)((long)pSrc_void + lVar6 + 0x10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)pDst_void + lVar6 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      *(undefined8 *)((long)pDst_void + lVar6) = uVar3;
      ((undefined8 *)((long)pDst_void + lVar6))[1] = uVar4;
      lVar6 = lVar6 + 0x28;
    } while ((ulong)num * 0x28 != lVar6);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }